

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  int iVar1;
  LogMessage *pLVar2;
  undefined4 extraout_var;
  LogFinisher local_69;
  string local_68;
  LogMessage local_48;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[8])();
  if ((char)iVar1 == '\0') {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x82);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"CHECK failed: IsInitialized(): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"Message of type \"");
    iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x15])(this);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)(CONCAT44(extraout_var,iVar1) + 8))
    ;
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\" is missing required fields: ");
    (*(this->super_MessageLite)._vptr_MessageLite[9])(&local_68,this);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_68);
    internal::LogFinisher::operator=(&local_69,pLVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    internal::LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void Message::CheckInitialized() const {
  GOOGLE_CHECK(IsInitialized()) << "Message of type \"" << GetDescriptor()->full_name()
                         << "\" is missing required fields: "
                         << InitializationErrorString();
}